

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_example.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  iterator iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  __node_base *p_Var6;
  __node_base *p_Var7;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> my_integers_set;
  int integers [6];
  key_type local_74;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_70;
  value_type local_38 [6];
  
  local_70._M_buckets = &local_70._M_single_bucket;
  local_70._M_bucket_count = 1;
  p_Var7 = &local_70._M_before_begin;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_element_count = 0;
  local_70._M_rehash_policy._M_max_load_factor = 1.0;
  local_70._M_rehash_policy._M_next_resize = 0;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  local_38[0] = 2;
  local_38[1] = 1;
  local_38[2] = 3;
  local_38[3] = 2;
  local_38[4] = 3;
  local_38[5] = 1;
  for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 4) {
    std::__detail::
    _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&local_70,(value_type *)((long)local_38 + lVar5));
  }
  std::operator<<((ostream *)&std::cout,"Elements of set\n");
  p_Var6 = p_Var7;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,(int)*(size_type *)(p_Var6 + 1));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Set size: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_74 = 5;
  iVar2 = std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&local_70,&local_74);
  pcVar3 = "Element found in set";
  pcVar4 = "Element found in set";
  if (iVar2.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
    pcVar4 = "Element not found in set";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_74 = 1;
  iVar2 = std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&local_70,&local_74);
  pcVar4 = "Element found in set";
  if (iVar2.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
    pcVar4 = "Element not found in set";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::erase(&local_70,(const_iterator)iVar2.super__Node_iterator_base<int,_false>._M_cur);
  local_74 = 1;
  iVar2 = std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&local_70,&local_74);
  if (iVar2.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
    pcVar3 = "Element not found in set";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Elements of set\n");
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,(int)*(size_type *)(p_Var7 + 1));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Set size: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_70);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  // Declaration of a unordered_set is very similar to a vector.
  std::unordered_set<int> my_integers_set;
  // Let's insert elements into the set from an array.
  int integers[] = {2, 1, 3, 2, 3, 1};
  // A neat trick to get the size of arrays.
  const int kArraySize = sizeof(integers) / sizeof(integers[0]);
  for (int i = 0; i < kArraySize; ++i) {
    my_integers_set.insert(integers[i]);
  }
  // Let's print out the contents of set.
  std::cout << "Elements of set\n";
  for (int element : my_integers_set) {
    std::cout << element << std::endl;
  }
  std::cout << "Set size: " << my_integers_set.size() << std::endl;
  // Sets are useful to search elements. However, it requires knowledge of
  // iterators. See iteratorsexample.cc to see more examples about iterators.
  // Say we want to see if the number 5 is in the set.
  // The set returns an iterator different than std::set::end() when the element
  // is present in the set, and returns std::set::end() otherwise.
  // Let's search for an element not in the set.
  std::unordered_set<int>::iterator iterator = my_integers_set.find(5);
  if (iterator == my_integers_set.end()) {
    std::cout << "Element not found in set" << std::endl;
  } else {
    std::cout << "Element found in set" << std::endl;
  }
  // Let's search for an element in the set.
  iterator = my_integers_set.find(1);
  if (iterator == my_integers_set.end()) {
    std::cout << "Element not found in set" << std::endl;
  } else {
    std::cout << "Element found in set" << std::endl;
  }
  // Note that the elements are sorted. This is because the set exploits
  // the ordering property to organize the elements and remove duplicates.
  // To erase elements we need to understand what iterators are, see
  // iterators_example.cc for explanation and illustration of iterators.
  // To erase one element from the set, we need to obtain an iterator first to
  // that element and pass the iterator as the element to erase.
  my_integers_set.erase(iterator);
  // Let's verify that it erased the element, in this case will erase 1 since
  // iterator is "pointing" to it.
  iterator = my_integers_set.find(1);
  if (iterator == my_integers_set.end()) {
    std::cout << "Element not found in set" << std::endl;
  } else {
    std::cout << "Element found in set" << std::endl;
  }
  // Let's print out the contents of set.
  std::cout << "Elements of set\n";
  for (int element : my_integers_set) {
    std::cout << element << std::endl;
  }
  std::cout << "Set size: " << my_integers_set.size() << std::endl;
  return 0;
}